

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O1

int Scl_LibertyReadCellIsDontUse(Scl_Tree_t *p,Scl_Item_t *pCell)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  int iVar4;
  int iVar5;
  Scl_Item_t *pSVar6;
  
  uVar1 = pCell->Child;
  iVar2 = p->nItems;
  if (iVar2 <= (int)uVar1) {
LAB_0045cfcc:
    __assert_fail("v < p->nItems",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLiberty.c"
                  ,0x4d,"Scl_Item_t *Scl_LibertyItem(Scl_Tree_t *, int)");
  }
  if ((int)uVar1 < 0) {
    pSVar6 = (Scl_Item_t *)0x0;
  }
  else {
    pSVar6 = p->pItems + uVar1;
  }
  if (pSVar6 != (Scl_Item_t *)0x0) {
    pcVar3 = p->pContents;
    do {
      iVar5 = (pSVar6->Key).Beg;
      iVar4 = (pSVar6->Key).End - iVar5;
      iVar5 = strncmp(pcVar3 + iVar5,"dont_use",(long)iVar4);
      if (iVar4 == 8 && iVar5 == 0) {
        return 1;
      }
      uVar1 = pSVar6->Next;
      if (iVar2 <= (int)uVar1) goto LAB_0045cfcc;
      if ((int)uVar1 < 0) {
        pSVar6 = (Scl_Item_t *)0x0;
      }
      else {
        pSVar6 = p->pItems + uVar1;
      }
    } while (pSVar6 != (Scl_Item_t *)0x0);
  }
  return 0;
}

Assistant:

int Scl_LibertyReadCellIsDontUse( Scl_Tree_t * p, Scl_Item_t * pCell )
{
    Scl_Item_t * pAttr;
    Scl_ItemForEachChild( p, pCell, pAttr )
        if ( !Scl_LibertyCompare(p, pAttr->Key, "dont_use") )
            return 1;
    return 0;
}